

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O0

void __thiscall
helics::Endpoint::sendTo(Endpoint *this,char *data,size_t data_size,string_view dest)

{
  string_view message;
  Modes MVar1;
  bool bVar2;
  undefined8 uVar3;
  size_t in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  char *in_R8;
  __sv_type _Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t local_38;
  char *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_len = in_RCX;
  local_10._M_str = in_R8;
  MVar1 = Federate::getCurrentMode((Federate *)0x3eccb7);
  if ((MVar1 != EXECUTING) &&
     (MVar1 = Federate::getCurrentMode((Federate *)0x3eccd0), MVar1 != INITIALIZING)) {
    uVar3 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_RDI);
    message._M_str = in_stack_ffffffffffffffb0;
    message._M_len = in_stack_ffffffffffffffa8;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)in_stack_ffffffffffffffa0,message);
    __cxa_throw(uVar3,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar2) {
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff90);
    local_38 = _Var4._M_len;
    local_10._M_len = local_38;
    local_30 = _Var4._M_str;
    local_10._M_str = local_30;
  }
  (**(code **)(**(long **)(in_RDI + 8) + 600))
            (*(long **)(in_RDI + 8),*(undefined4 *)(in_RDI + 0x10),in_RSI,in_RDX,local_10._M_len,
             local_10._M_str);
  return;
}

Assistant:

void Endpoint::sendTo(const char* data, size_t data_size, std::string_view dest) const
{
    if ((fed->getCurrentMode() == Federate::Modes::EXECUTING) ||
        (fed->getCurrentMode() == Federate::Modes::INITIALIZING)) {
        if (dest.empty()) {
            dest = defDest;
        }
        mCore->sendTo(handle, data, data_size, dest);
    } else {
        throw(InvalidFunctionCall(
            "messages not allowed outside of execution and initialization mode"));
    }
}